

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O0

int InitP33x(P33X *pP33x)

{
  int iVar1;
  uint8 local_28;
  uint8 local_27 [4];
  uint8 uStack_23;
  uint8 local_22;
  char local_21;
  uint8 crc_l;
  uint8 crc_h;
  uint8 writebuf [4];
  uint8 readbuf [10];
  P33X *pP33x_local;
  
  local_27[0] = '\0';
  local_28 = '\0';
  local_27[1] = 0xfa;
  local_27[2] = 0x30;
  CalcCRC16(local_27 + 1,2,local_27 + 3,&uStack_23);
  iVar1 = WriteAllRS232Port(&pP33x->RS232Port,local_27 + 1,4);
  if (iVar1 == 0) {
    iVar1 = ReadAllRS232Port(&pP33x->RS232Port,&local_22,4);
    if (iVar1 == 0) {
      iVar1 = ReadAllRS232Port(&pP33x->RS232Port,&local_22,10);
      if (iVar1 == 0) {
        if (local_22 == 0xfa) {
          if (local_21 == '0') {
            CalcCRC16(&local_22,8,local_27,&local_28);
            if ((readbuf[0] == local_27[0]) && (readbuf[1] == local_28)) {
              pP33x_local._4_4_ = 0;
            }
            else {
              printf("Error reading data from a P33x : Bad CRC-16. \n");
              pP33x_local._4_4_ = 1;
            }
          }
          else {
            printf("Error reading data from a P33x : The device function failed. \n");
            pP33x_local._4_4_ = 1;
          }
        }
        else {
          printf("Error reading data from a P33x : Bad device address. \n");
          pP33x_local._4_4_ = 1;
        }
      }
      else {
        printf("Error reading data from a P33x. \n");
        pP33x_local._4_4_ = 1;
      }
    }
    else {
      printf("Error reading data from a P33x. \n");
      pP33x_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a P33x. \n");
    pP33x_local._4_4_ = 1;
  }
  return pP33x_local._4_4_;
}

Assistant:

inline int InitP33x(P33X* pP33x)
{
	uint8 readbuf[10];
	uint8 writebuf[4];
	uint8 crc_h = 0;
	uint8 crc_l = 0;
	//int devclass = 0;
	//int group = 0;
	//int year = 0;
	//int week = 0;
	//int buf = 0;
	//int stat = 0;

	writebuf[0] = (uint8)0xfa; // device address = 250
	writebuf[1] = (uint8)0x30; // function 48
	CalcCRC16(writebuf, 4-2, &(writebuf[2]), &(writebuf[3])); // CRC-16

	if (WriteAllRS232Port(&pP33x->RS232Port, writebuf, 4) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the echo.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 4) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the data.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 10) != EXIT_SUCCESS)
	{ 
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Device address = 250.
	if (readbuf[0] != (uint8)0xfa)
	{ 
		printf("Error reading data from a P33x : Bad device address. \n");
		return EXIT_FAILURE;	
	}

	// Function 48.
	if (readbuf[1] != (uint8)0x30)
	{ 
		printf("Error reading data from a P33x : The device function failed. \n");
		return EXIT_FAILURE;	
	}

	CalcCRC16(readbuf, 10-2, &crc_h, &crc_l);

	// CRC-16.
	if ((readbuf[8] != crc_h)||(readbuf[9] != crc_l))
	{ 
		printf("Error reading data from a P33x : Bad CRC-16. \n");
		return EXIT_FAILURE;	
	}

	//devclass = readbuf[2];
	//group = readbuf[3];
	//year = readbuf[4];
	//week = readbuf[5];
	//buf = readbuf[6];
	//stat = readbuf[7];

	//PRINT_DEBUG_MESSAGE_OSUTILS(("Device ID : %d.%d\n", devclass, group));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Firmware version : %d.%d\n", year, week));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Length of the internal receive buffer : %d\n", buf));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Status information : %d\n", stat));

	return EXIT_SUCCESS;
}